

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O2

SymbolEntryMap * __thiscall
bhf::ads::SymbolAccess::FetchSymbolEntries_abi_cxx11_
          (SymbolEntryMap *__return_storage_ptr__,SymbolAccess *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  ostream *poVar3;
  AdsException *pAVar4;
  size_t length;
  int iVar5;
  SymbolEntry *this_00;
  bool bVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>,_bool>
  pVar7;
  uint32_t bytesRead;
  int local_258;
  uint local_254;
  vector<unsigned_char,_std::allocator<unsigned_char>_> symbols;
  SymbolEntry next;
  stringstream stream;
  ostream local_1a8 [376];
  
  bytesRead = 0;
  lVar2 = AdsDevice::ReadReqEx2(&this->device,0xf00c,0,8,&local_258,&bytesRead);
  if (lVar2 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar3 = std::operator<<(local_1a8,"FetchSymbolEntries");
    poVar3 = std::operator<<(poVar3,"(): Reading symbol info failed with: 0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)&next);
    std::__cxx11::string::~string((string *)&next);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    pAVar4 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar4,lVar2);
    __cxa_throw(pAVar4,&AdsException::typeinfo,AdsException::~AdsException);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&symbols,(ulong)local_254,(allocator_type *)&stream);
  length = (size_t)local_254;
  lVar2 = AdsDevice::ReadReqEx2
                    (&this->device,0xf00b,0,length,
                     symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&bytesRead);
  if (lVar2 == 0) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar5 = local_258 + 1;
    this_00 = (SymbolEntry *)
              symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        poVar3 = std::operator<<(local_1a8,"FetchSymbolEntries");
        poVar3 = std::operator<<(poVar3,"(): nSymbols: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3," nSymSize:");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"\'\n");
        std::__cxx11::stringbuf::str();
        Logger::Log(3,(string *)&next);
        std::__cxx11::string::~string((string *)&next);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        pAVar4 = (AdsException *)__cxa_allocate_exception(0x30);
        AdsException::AdsException(pAVar4,0x706);
        __cxa_throw(pAVar4,&AdsException::typeinfo,AdsException::~AdsException);
      }
      SymbolEntry::Parse_abi_cxx11_
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
                  *)&stream,this_00,(uint8_t *)(ulong)bytesRead,length);
      pVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,bhf::ads::SymbolEntry>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bhf::ads::SymbolEntry>>>
                          *)__return_storage_ptr__,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
                          *)&stream);
      SymbolEntry::SymbolEntry(&next,(SymbolEntry *)(pVar7.first._M_node._M_node + 2));
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
               *)&stream);
      this_00 = (SymbolEntry *)
                ((long)&(this_00->header).entryLength + (ulong)next.header.entryLength);
      bytesRead = bytesRead - next.header.entryLength;
      bVar6 = bytesRead != 0;
      SymbolEntry::~SymbolEntry(&next);
    } while (bVar6);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&symbols.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar3 = std::operator<<(local_1a8,"FetchSymbolEntries");
  poVar3 = std::operator<<(poVar3,"(): Reading symbols failed with: 0x");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3,'\n');
  std::__cxx11::stringbuf::str();
  Logger::Log(3,(string *)&next);
  std::__cxx11::string::~string((string *)&next);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  pAVar4 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(pAVar4,lVar2);
  __cxa_throw(pAVar4,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

SymbolEntryMap SymbolAccess::FetchSymbolEntries() const
{
    uint32_t bytesRead = 0;
    struct AdsSymbolUploadInfo {
        uint32_t nSymbols;
        uint32_t nSymSize;
    } uploadInfo;
    auto status = device.ReadReqEx2(ADSIGRP_SYM_UPLOADINFO,
                                    0,
                                    sizeof(uploadInfo),
                                    &uploadInfo,
                                    &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): Reading symbol info failed with: 0x" << std::hex << status << '\n');
        throw AdsException(status);
    }

    uploadInfo.nSymSize = bhf::ads::letoh(uploadInfo.nSymSize);
    std::vector<uint8_t> symbols(uploadInfo.nSymSize);
    status = device.ReadReqEx2(ADSIGRP_SYM_UPLOAD,
                               0,
                               uploadInfo.nSymSize,
                               symbols.data(),
                               &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): Reading symbols failed with: 0x" << std::hex << status << '\n');
        throw AdsException(status);
    }

    const uint8_t* data = symbols.data();
    auto nSymbols = bhf::ads::letoh(uploadInfo.nSymbols);
    auto entries = std::map<std::string, SymbolEntry> {};
    while (nSymbols--) {
        const auto next = entries.insert(bhf::ads::SymbolEntry::Parse(data, bytesRead)).first->second;
        bytesRead -= next.header.entryLength;
        data += next.header.entryLength;
        if (!bytesRead) {
            return entries;
        }
    }
    LOG_ERROR(__FUNCTION__ << "(): nSymbols: " << uploadInfo.nSymbols << " nSymSize:" << uploadInfo.nSymSize << "'\n");
    throw AdsException(ADSERR_DEVICE_INVALIDDATA);
}